

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.cpp
# Opt level: O2

int luaB_tonumber(lua_State *L)

{
  char cVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *__s;
  lua_Integer lVar6;
  size_t sVar7;
  byte bVar8;
  byte *__s_00;
  double n;
  undefined4 uVar9;
  undefined4 uVar10;
  int isnum;
  undefined8 local_48;
  undefined8 uStack_40;
  size_t l;
  
  iVar3 = lua_type(L,2);
  if (iVar3 < 1) {
    n = lua_tonumberx(L,1,&isnum);
    if (isnum != 0) {
LAB_0011896f:
      lua_pushnumber(L,n);
      return 1;
    }
    luaL_checkany(L,1);
  }
  else {
    __s = luaL_checklstring(L,1,&l);
    lVar6 = luaL_checkinteger(L,2);
    iVar3 = (int)lVar6;
    if (0x22 < iVar3 - 2U) {
      luaL_argerror(L,2,"base out of range");
    }
    sVar7 = strspn(__s," \f\n\r\t\v");
    cVar1 = __s[sVar7];
    __s_00 = (byte *)(__s + ((cVar1 - 0x2bU & 0xfd) == 0) + sVar7);
    bVar8 = *__s_00;
    iVar4 = isalnum((uint)bVar8);
    if (iVar4 != 0) {
      uVar9 = 0;
      uVar10 = 0;
      do {
        dVar2 = (double)CONCAT44(uVar10,uVar9);
        if (bVar8 - 0x30 < 10) {
          iVar4 = (char)bVar8 + -0x30;
        }
        else {
          iVar4 = toupper((uint)bVar8);
          iVar4 = iVar4 + -0x37;
        }
        local_48 = dVar2 * (double)iVar3 + (double)iVar4;
        uStack_40 = 0;
        if (iVar3 <= iVar4) break;
        bVar8 = __s_00[1];
        __s_00 = __s_00 + 1;
        iVar5 = isalnum((uint)bVar8);
        uVar9 = (undefined4)local_48;
        uVar10 = local_48._4_4_;
      } while (iVar5 != 0);
      sVar7 = strspn((char *)__s_00," \f\n\r\t\v");
      if (__s_00 + sVar7 == (byte *)(__s + l)) {
        n = local_48;
        if (iVar3 <= iVar4) {
          n = dVar2;
        }
        if (cVar1 == '-') {
          n = -n;
        }
        goto LAB_0011896f;
      }
    }
  }
  lua_pushnil(L);
  return 1;
}

Assistant:

static int luaB_tonumber (lua_State *L) {
  if (lua_isnoneornil(L, 2)) {  /* standard conversion */
    int isnum;
    lua_Number n = lua_tonumberx(L, 1, &isnum);
    if (isnum) {
      lua_pushnumber(L, n);
      return 1;
    }  /* else not a number; must be something */
    luaL_checkany(L, 1);
  }
  else {
    size_t l;
    const char *s = luaL_checklstring(L, 1, &l);
    const char *e = s + l;  /* end point for 's' */
    int base = luaL_checkint(L, 2);
    int neg = 0;
    luaL_argcheck(L, 2 <= base && base <= 36, 2, "base out of range");
    s += strspn(s, SPACECHARS);  /* skip initial spaces */
    if (*s == '-') { s++; neg = 1; }  /* handle signal */
    else if (*s == '+') s++;
    if (isalnum((unsigned char)*s)) {
      lua_Number n = 0;
      do {
        int digit = (isdigit((unsigned char)*s)) ? *s - '0'
                       : toupper((unsigned char)*s) - 'A' + 10;
        if (digit >= base) break;  /* invalid numeral; force a fail */
        n = n * (lua_Number)base + (lua_Number)digit;
        s++;
      } while (isalnum((unsigned char)*s));
      s += strspn(s, SPACECHARS);  /* skip trailing spaces */
      if (s == e) {  /* no invalid trailing characters? */
        lua_pushnumber(L, (neg) ? -n : n);
        return 1;
      }  /* else not a number */
    }  /* else not a number */
  }
  lua_pushnil(L);  /* not a number */
  return 1;
}